

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_lev.c
# Opt level: O2

boolean check_room(level *lev,xchar *lowx,xchar *ddx,xchar *lowy,xchar *ddy,boolean vault)

{
  char cVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  byte bVar5;
  int iVar6;
  boolean bVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  schar *psVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  
  cVar1 = *lowx;
  cVar2 = *ddx;
  cVar3 = *lowy;
  cVar4 = *ddy;
  uVar12 = (int)cVar3;
  if (cVar1 < 3) {
    *lowx = '\x03';
    uVar12 = (uint)(byte)*lowy;
  }
  iVar10 = (int)cVar2 + (int)cVar1;
  iVar6 = (int)cVar4 + (int)cVar3;
  uVar14 = 4 - (vault == '\0');
  uVar13 = vault == '\0' ^ 5;
  if ((char)uVar12 < '\x02') {
    *lowy = '\x02';
    uVar12 = 2;
  }
  iVar16 = 0x4d;
  if (iVar10 < 0x4d) {
    iVar16 = iVar10;
  }
  iVar10 = 0x12;
  if (iVar6 < 0x12) {
    iVar10 = iVar6;
  }
LAB_002399cf:
  iVar6 = uVar14 + iVar10;
  if (0x13 < (int)(uVar14 + iVar10)) {
    iVar6 = 0x14;
  }
LAB_002399e0:
  cVar1 = *lowx;
  if ((cVar1 < iVar16) && ((char)uVar12 < iVar10)) {
    uVar15 = (int)cVar1 - uVar13;
    uVar12 = (int)(char)uVar12 - uVar14;
    if ((int)uVar12 < 1) {
      uVar12 = 0;
    }
    for (; (int)uVar15 <= (int)(iVar16 + uVar13); uVar15 = uVar15 + 1) {
      if (0xffffffb0 < uVar15 - 0x50) {
        psVar11 = &lev->locations[uVar15][uVar12].typ;
        uVar9 = (ulong)uVar12;
        bVar5 = (char)uVar14 + (char)uVar12;
        while( true ) {
          bVar5 = bVar5 + 1;
          iVar8 = (int)uVar9;
          if (iVar6 < iVar8) break;
          if (*psVar11 != '\0') {
            uVar12 = mt_random();
            if (uVar12 % 3 == 0) {
              return '\0';
            }
            if ((int)uVar15 < (int)*lowx) {
              *lowx = (char)uVar15 + (char)uVar13 + '\x01';
            }
            else {
              iVar16 = uVar15 + ~uVar13;
            }
            uVar12 = (uint)*lowy;
            if (iVar8 < (int)uVar12) {
              *lowy = bVar5;
              uVar12 = (uint)bVar5;
              goto LAB_002399e0;
            }
            iVar10 = iVar8 + ~uVar14;
            goto LAB_002399cf;
          }
          uVar9 = (ulong)(iVar8 + 1);
          psVar11 = psVar11 + 0xc;
        }
      }
    }
    *ddx = (char)iVar16 - cVar1;
    *ddy = (char)iVar10 - *lowy;
    bVar7 = '\x01';
  }
  else {
    bVar7 = '\0';
  }
  return bVar7;
}

Assistant:

boolean check_room(struct level *lev, xchar *lowx, xchar *ddx,
		   xchar *lowy, xchar *ddy, boolean vault)
{
	int x, y, hix = *lowx + *ddx, hiy = *lowy + *ddy;
	struct rm *loc;
	int xlim, ylim, ymax;

	xlim = XLIM + (vault ? 1 : 0);
	ylim = YLIM + (vault ? 1 : 0);

	if (*lowx < 3)		*lowx = 3;
	if (*lowy < 2)		*lowy = 2;
	if (hix > COLNO-3)	hix = COLNO - 3;
	if (hiy > ROWNO-3)	hiy = ROWNO - 3;
chk:
	if (hix <= *lowx || hiy <= *lowy)	return FALSE;

	/* check area around room (and make room smaller if necessary) */
	for (x = *lowx - xlim; x <= hix + xlim; x++) {
		if (x <= 0 || x >= COLNO) continue;
		y = *lowy - ylim;
		ymax = hiy + ylim;
		if (y < 0)
		    y = 0;
		if (ymax >= ROWNO)
		    ymax = ROWNO - 1;
		loc = &lev->locations[x][y];
		
		for (; y <= ymax; y++) {
			if (loc++->typ) {
				if (!rn2(3))
				    return FALSE;

				if (x < *lowx)
				    *lowx = x + xlim + 1;
				else
				    hix = x - xlim - 1;
				if (y < *lowy)
				    *lowy = y + ylim + 1;
				else
				    hiy = y - ylim - 1;
				goto chk;
			}
		}
	}
	*ddx = hix - *lowx;
	*ddy = hiy - *lowy;
	return TRUE;
}